

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

bool __thiscall
capnp::compiler::BrandedDecl::compileAsType
          (BrandedDecl *this,ErrorReporter *errorReporter,Builder target)

{
  Builder target_00;
  Reader name;
  CapTableBuilder *pCVar1;
  anon_class_8_1_a7dcfa9e aVar2;
  bool bVar3;
  uint uVar4;
  uint64_t uVar5;
  SegmentBuilder *pSVar6;
  char *pcVar7;
  undefined8 unaff_RBX;
  ulong uVar8;
  ulong uVar9;
  char (*in_R8) [17];
  undefined8 uVar10;
  ResolvedParameter RVar11;
  Builder interface;
  SegmentReader *pSVar12;
  CapTableReader *pCVar13;
  void *pvVar14;
  WirePointer *pWVar15;
  undefined8 uVar16;
  StructBuilder local_88;
  anon_class_8_1_a7dcfa9e local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  if ((this->body).tag == 2) {
    RVar11 = asVariable(this);
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    if (RVar11.id == 0) {
      *(undefined2 *)((long)target._builder.data + 8) = 2;
    }
    else {
      *(undefined2 *)((long)target._builder.data + 8) = 1;
      *(uint64_t *)((long)target._builder.data + 0x10) = RVar11.id;
    }
    *(short *)((long)target._builder.data + 10) = (short)RVar11.index;
    return true;
  }
  switch(*(undefined2 *)((long)&(this->body).field_1 + 0x18)) {
  case 0:
  case 1:
  case 2:
  case 4:
  case 6:
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    pSVar12 = (this->source)._reader.segment;
    pCVar13 = (this->source)._reader.capTable;
    pvVar14 = (this->source)._reader.data;
    pWVar15 = (this->source)._reader.pointers;
    uVar10._0_4_ = (this->source)._reader.dataSize;
    uVar10._4_2_ = (this->source)._reader.pointerCount;
    uVar10._6_2_ = *(undefined2 *)&(this->source)._reader.field_0x26;
    uVar16 = *(undefined8 *)&(this->source)._reader.nestingLimit;
    name._reader.capTable = (CapTableReader *)in_stack_ffffffffffffffc8;
    name._reader.segment = (SegmentReader *)in_stack_ffffffffffffffc0;
    name._reader.data = (void *)in_stack_ffffffffffffffd0;
    name._reader.pointers = (WirePointer *)in_stack_ffffffffffffffd8;
    name._reader._32_8_ = in_stack_ffffffffffffffe0;
    name._reader._40_8_ = unaff_RBX;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[17]>
              ((String *)&local_88,(kj *)0x5a3f37,(char (*) [2])&stack0xffffffffffffffa8,
               (String *)"\' is not a type.",in_R8);
    pSVar6 = local_88.segment;
    if (local_88.capTable == (CapTableBuilder *)0x0) {
      pSVar6 = (SegmentBuilder *)0x54bab9;
    }
    uVar4 = (this->source)._reader.dataSize;
    uVar9 = 0;
    uVar8 = 0;
    if (0x3f < uVar4) {
      uVar8 = (ulong)*(uint *)((long)(this->source)._reader.data + 4);
    }
    if (0x9f < uVar4) {
      uVar9 = (ulong)*(uint *)((long)(this->source)._reader.data + 0x10);
    }
    (**errorReporter->_vptr_ErrorReporter)
              (errorReporter,uVar8,uVar9,pSVar6,
               (long)&((local_88.capTable)->super_CapTableReader)._vptr_CapTableReader +
               (ulong)(local_88.capTable == (CapTableBuilder *)0x0));
    pCVar1 = local_88.capTable;
    pSVar6 = local_88.segment;
    if (local_88.segment != (SegmentBuilder *)0x0) {
      local_88.segment = (SegmentBuilder *)0x0;
      local_88.capTable = (CapTableBuilder *)0x0;
      (*(code *)**local_88.data)
                (local_88.data,pSVar6,1,pCVar1,pCVar1,0,pSVar12,pCVar13,pvVar14,pWVar15,uVar10,
                 uVar16);
    }
    uVar10 = uStack_50;
    aVar2.enum_ = local_58.enum_;
    if ((BrandedDecl *)local_58.enum_ == (BrandedDecl *)0x0) {
      return false;
    }
    local_58.enum_ = (Builder *)0x0;
    uStack_50 = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)local_48)(local_48,aVar2.enum_,1,uVar10,uVar10,0);
    return false;
  case 3:
    capnp::schema::Type::Builder::initEnum((Builder *)&local_88,&target);
    local_58.enum_ = (Builder *)&local_88;
    uVar5 = getIdAndFillBrand<capnp::compiler::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__0>
                      (this,&stack0xffffffffffffffa8);
    goto LAB_003f99f9;
  case 5:
    capnp::schema::Type::Builder::initStruct((Builder *)&local_88,&target);
    local_58.enum_ = (Builder *)&local_88;
    uVar5 = getIdAndFillBrand<capnp::compiler::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__1>
                      (this,(anon_class_8_1_1336220a *)&stack0xffffffffffffffa8);
    goto LAB_003f99f9;
  case 9:
    capnp::schema::Type::Builder::initInterface((Builder *)&local_88,&target);
    local_58.enum_ = (Builder *)&local_88;
    uVar5 = getIdAndFillBrand<capnp::compiler::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__2>
                      (this,(anon_class_8_1_338df3d9 *)&stack0xffffffffffffffa8);
LAB_003f99f9:
    *(uint64_t *)((long)local_88.data + 8) = uVar5;
    break;
  case 0xe:
    *(undefined2 *)target._builder.data = 0;
    break;
  case 0xf:
    *(undefined2 *)target._builder.data = 1;
    break;
  case 0x10:
    *(undefined2 *)target._builder.data = 2;
    break;
  case 0x11:
    *(undefined2 *)target._builder.data = 3;
    break;
  case 0x12:
    *(undefined2 *)target._builder.data = 4;
    break;
  case 0x13:
    *(undefined2 *)target._builder.data = 5;
    break;
  case 0x14:
    *(undefined2 *)target._builder.data = 6;
    break;
  case 0x15:
    *(undefined2 *)target._builder.data = 7;
    break;
  case 0x16:
    *(undefined2 *)target._builder.data = 8;
    break;
  case 0x17:
    *(undefined2 *)target._builder.data = 9;
    break;
  case 0x18:
    *(undefined2 *)target._builder.data = 10;
    break;
  case 0x19:
    *(undefined2 *)target._builder.data = 0xb;
    break;
  case 0x1a:
    *(undefined2 *)target._builder.data = 0xc;
    break;
  case 0x1b:
    *(undefined2 *)target._builder.data = 0xd;
    break;
  case 0x1c:
    capnp::schema::Type::Builder::initList((Builder *)&stack0xffffffffffffffa8,&target);
    capnp::_::PointerBuilder::initStruct
              (&local_88,(PointerBuilder *)&stack0xffffffffffffffd0,(StructSize)0x10003);
    getListParam((BrandedDecl *)&stack0xffffffffffffffa8);
    if ((BrandedDecl *)local_58.enum_ == (BrandedDecl *)0x0) {
      uVar4 = (this->source)._reader.dataSize;
      uVar9 = 0;
      uVar8 = 0;
      if (0x3f < uVar4) {
        uVar8 = (ulong)*(uint *)((long)(this->source)._reader.data + 4);
      }
      if (0x9f < uVar4) {
        uVar9 = (ulong)*(uint *)((long)(this->source)._reader.data + 0x10);
      }
      (**errorReporter->_vptr_ErrorReporter)
                (errorReporter,uVar8,uVar9,"\'List\' requires exactly one parameter.",0x27);
    }
    else {
      target_00._builder.capTable = local_88.capTable;
      target_00._builder.segment = local_88.segment;
      target_00._builder.data = local_88.data;
      target_00._builder.pointers = local_88.pointers;
      target_00._builder.dataSize = local_88.dataSize;
      target_00._builder.pointerCount = local_88.pointerCount;
      target_00._builder._38_2_ = local_88._38_2_;
      bVar3 = compileAsType((BrandedDecl *)local_58.enum_,errorReporter,target_00);
      if (bVar3) {
        if (*local_88.data != 0x12) {
          return true;
        }
        if (*(short *)((long)local_88.data + 10) == 1) {
          uVar4 = (this->source)._reader.dataSize;
          uVar9 = 0;
          if (0x3f < uVar4) {
            uVar9 = (ulong)*(uint *)((long)(this->source)._reader.data + 4);
          }
          uVar10 = 0x24;
          pcVar7 = "\'List(AnyStruct)\' is not supported.";
        }
        else {
          if (*(short *)((long)local_88.data + 10) != 0) {
            return true;
          }
          uVar4 = (this->source)._reader.dataSize;
          uVar9 = 0;
          if (0x3f < uVar4) {
            uVar9 = (ulong)*(uint *)((long)(this->source)._reader.data + 4);
          }
          uVar10 = 0x25;
          pcVar7 = "\'List(AnyPointer)\' is not supported.";
        }
        uVar8 = 0;
        if (0x9f < uVar4) {
          uVar8 = (ulong)*(uint *)((long)(this->source)._reader.data + 0x10);
        }
        (**errorReporter->_vptr_ErrorReporter)(errorReporter,uVar9,uVar8,pcVar7,uVar10);
        *(short *)local_88.data = 0;
      }
    }
    return false;
  case 0x1d:
    uVar4 = (this->source)._reader.dataSize;
    uVar9 = 0;
    uVar8 = 0;
    if (0x3f < uVar4) {
      uVar8 = (ulong)*(uint *)((long)(this->source)._reader.data + 4);
    }
    if (0x9f < uVar4) {
      uVar9 = (ulong)*(uint *)((long)(this->source)._reader.data + 0x10);
    }
    (**errorReporter->_vptr_ErrorReporter)
              (errorReporter,uVar8,uVar9,
               "As of Cap\'n Proto 0.4, \'Object\' has been renamed to \'AnyPointer\'.  Sorry for the inconvenience, and thanks for being an early adopter.  :)"
               ,0x8b);
  case 0x1e:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    break;
  case 0x1f:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0x10000;
    break;
  case 0x20:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0x20000;
    break;
  case 0x21:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0x30000;
    break;
  default:
    kj::_::unreachable();
  }
  return true;
}

Assistant:

bool BrandedDecl::compileAsType(
    ErrorReporter& errorReporter, schema::Type::Builder target) {
  KJ_IF_SOME(kind, getKind()) {
    switch (kind) {
      case Declaration::ENUM: {
        auto enum_ = target.initEnum();
        enum_.setTypeId(getIdAndFillBrand([&]() { return enum_.initBrand(); }));
        return true;
      }

      case Declaration::STRUCT: {
        auto struct_ = target.initStruct();
        struct_.setTypeId(getIdAndFillBrand([&]() { return struct_.initBrand(); }));
        return true;
      }

      case Declaration::INTERFACE: {
        auto interface = target.initInterface();
        interface.setTypeId(getIdAndFillBrand([&]() { return interface.initBrand(); }));
        return true;
      }

      case Declaration::BUILTIN_LIST: {
        auto elementType = target.initList().initElementType();

        KJ_IF_SOME(param, getListParam()) {
          if (!param.compileAsType(errorReporter, elementType)) {
            return false;
          }
        } else {
          addError(errorReporter, "'List' requires exactly one parameter.");
          return false;
        }

        if (elementType.isAnyPointer()) {
          auto unconstrained = elementType.getAnyPointer().getUnconstrained();

          if (unconstrained.isAnyKind()) {
            addError(errorReporter, "'List(AnyPointer)' is not supported.");
            // Seeing List(AnyPointer) later can mess things up, so change the type to Void.
            elementType.setVoid();
            return false;
          } else if (unconstrained.isStruct()) {
            addError(errorReporter, "'List(AnyStruct)' is not supported.");
            // Seeing List(AnyStruct) later can mess things up, so change the type to Void.
            elementType.setVoid();
            return false;
          }
        }

        return true;
      }

      case Declaration::BUILTIN_VOID: target.setVoid(); return true;
      case Declaration::BUILTIN_BOOL: target.setBool(); return true;
      case Declaration::BUILTIN_INT8: target.setInt8(); return true;
      case Declaration::BUILTIN_INT16: target.setInt16(); return true;
      case Declaration::BUILTIN_INT32: target.setInt32(); return true;
      case Declaration::BUILTIN_INT64: target.setInt64(); return true;
      case Declaration::BUILTIN_U_INT8: target.setUint8(); return true;
      case Declaration::BUILTIN_U_INT16: target.setUint16(); return true;
      case Declaration::BUILTIN_U_INT32: target.setUint32(); return true;
      case Declaration::BUILTIN_U_INT64: target.setUint64(); return true;
      case Declaration::BUILTIN_FLOAT32: target.setFloat32(); return true;
      case Declaration::BUILTIN_FLOAT64: target.setFloat64(); return true;
      case Declaration::BUILTIN_TEXT: target.setText(); return true;
      case Declaration::BUILTIN_DATA: target.setData(); return true;

      case Declaration::BUILTIN_OBJECT:
        addError(errorReporter,
            "As of Cap'n Proto 0.4, 'Object' has been renamed to 'AnyPointer'.  Sorry for the "
            "inconvenience, and thanks for being an early adopter.  :)");
        KJ_FALLTHROUGH;
      case Declaration::BUILTIN_ANY_POINTER:
        target.initAnyPointer().initUnconstrained().setAnyKind();
        return true;
      case Declaration::BUILTIN_ANY_STRUCT:
        target.initAnyPointer().initUnconstrained().setStruct();
        return true;
      case Declaration::BUILTIN_ANY_LIST:
        target.initAnyPointer().initUnconstrained().setList();
        return true;
      case Declaration::BUILTIN_CAPABILITY:
        target.initAnyPointer().initUnconstrained().setCapability();
        return true;

      case Declaration::FILE:
      case Declaration::USING:
      case Declaration::CONST:
      case Declaration::ENUMERANT:
      case Declaration::FIELD:
      case Declaration::UNION:
      case Declaration::GROUP:
      case Declaration::METHOD:
      case Declaration::ANNOTATION:
      case Declaration::NAKED_ID:
      case Declaration::NAKED_ANNOTATION:
        addError(errorReporter, kj::str("'", toString(), "' is not a type."));
        return false;
    }

    KJ_UNREACHABLE;
  }